

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O1

char * rtosc_skip_next_printed_arg
                 (char *src,int *skipped,char *type,char *llhssrc,int follow_ellipsis,
                 int inside_bundle)

{
  byte bVar1;
  bool bVar2;
  char cVar3;
  char cVar4;
  int iVar5;
  int32_t iVar6;
  ushort **ppuVar7;
  char *pcVar8;
  size_t sVar9;
  char *pcVar10;
  size_t sVar11;
  ulong uVar12;
  rtosc_arg_val_t *rhsarg;
  char *pcVar13;
  bool bVar14;
  bool bVar15;
  char deltaless_range_type;
  char rhstype [2];
  char llhstype;
  char dummy;
  int rd;
  size_t zero;
  char arraytype_cur;
  int rhsskipped;
  int llhsskipped;
  int blobsize;
  rtosc_arg_val_t delta;
  char *local_e0;
  byte *local_d8;
  byte local_c9;
  int local_c8;
  byte local_c2 [2];
  char *local_c0;
  char *local_b8;
  byte local_aa;
  byte local_a9;
  rtosc_arg_val_t local_a8;
  int *local_90;
  size_t local_88;
  rtosc_arg_val_t local_80;
  int local_68;
  int local_64;
  rtosc_arg_val_t local_60;
  rtosc_arg_val_t local_48;
  
  local_d8 = &local_a9;
  if (type != (char *)0x0) {
    local_d8 = (byte *)type;
  }
  *skipped = 1;
  local_c9 = 0;
  bVar1 = *src;
  local_e0 = src;
  local_90 = skipped;
  if (bVar1 < 0x5b) {
    if (bVar1 < 0x27) {
      if (bVar1 == 0x22) {
        pcVar13 = src + 1;
        bVar15 = false;
        local_c8 = inside_bundle;
        local_c0 = llhssrc;
        local_b8 = src;
        while( true ) {
          cVar4 = *pcVar13;
          bVar14 = cVar4 == '\0';
          if (bVar14) {
            bVar2 = false;
          }
          else {
            bVar2 = (bool)(cVar4 != '\"' | bVar15);
            if (cVar4 != '\"' || bVar15) {
              do {
                pcVar13 = pcVar13 + 1;
                if ((!(bool)(bVar15 ^ 1U)) && (cVar3 = get_escaped_char(cVar4,0), cVar3 == '\0')) {
                  local_e0 = (char *)0x0;
                  src = local_b8;
                  goto LAB_0011383f;
                }
                bVar15 = (bool)(cVar4 == '\\' & (bVar15 ^ 1U));
                cVar4 = *pcVar13;
                bVar14 = cVar4 == '\0';
                src = local_b8;
              } while ((!bVar14) && (bVar2 = (bool)(cVar4 != '\"' | bVar15), bVar2));
            }
            bVar2 = (bool)(bVar2 ^ 1);
          }
          if ((!bVar2) || (pcVar13[1] != '\\')) break;
          local_a8._0_4_ = 0;
          __isoc99_sscanf(pcVar13,"\"\\ \"%n",&local_a8);
          pcVar13 = pcVar13 + (int)local_a8._0_4_;
          if ((long)(int)local_a8._0_4_ == 0) {
            pcVar13 = (char *)0x0;
          }
        }
        local_e0 = (char *)0x0;
        if (!bVar14) {
          local_e0 = pcVar13 + 1;
        }
LAB_0011383f:
        llhssrc = local_c0;
        inside_bundle = local_c8;
        if ((local_e0 == (char *)0x0) || (*local_e0 != 'S')) {
          *local_d8 = 0x73;
        }
        else {
          *local_d8 = 0x53;
          local_e0 = local_e0 + 1;
        }
      }
      else if (bVar1 == 0x23) {
        ppuVar7 = __ctype_b_loc();
        uVar12 = 0;
        do {
          pcVar13 = local_e0 + 1;
          local_e0 = local_e0 + 1;
          uVar12 = uVar12 + 1;
          if (((*ppuVar7)[*pcVar13] >> 0xc & 1) == 0) {
            uVar12 = 9;
            local_e0 = (char *)0x0;
          }
        } while (uVar12 < 8);
        pcVar8 = (char *)0x0;
        if (((*ppuVar7)[*pcVar13] >> 0xc & 1) != 0) {
          pcVar8 = local_e0 + 1;
        }
        *local_d8 = 0x72;
        local_e0 = pcVar8;
      }
      else {
LAB_0011378c:
        iVar5 = is_range_multiplier(src);
        if (iVar5 == 0) {
          pcVar13 = local_e0;
          if ((bVar1 == 0x5f) ||
             (ppuVar7 = __ctype_b_loc(), pcVar13 = local_e0,
             (*(byte *)((long)*ppuVar7 + (long)(char)bVar1 * 2 + 1) & 4) != 0)) {
            while ((cVar4 = *pcVar13, (long)cVar4 == 0x5f ||
                   (ppuVar7 = __ctype_b_loc(), ((*ppuVar7)[cVar4] & 8) != 0))) {
              pcVar13 = pcVar13 + 1;
            }
            *local_d8 = 0x53;
            local_e0 = pcVar13;
          }
          else {
            local_a8._0_4_ = 0;
            __isoc99_sscanf(src,"%*4d-%*1d%*1d-%*1d%*1d%n",&local_a8);
            local_e0 = local_e0 + (int)local_a8._0_4_;
            if ((long)(int)local_a8._0_4_ == 0) {
              sVar11 = skip_numeric(&local_e0,(char *)local_d8);
              if (sVar11 != 0) {
                cVar4 = *local_e0;
                pcVar13 = local_e0;
                while ((cVar4 != '\0' && (iVar5 = isspace((int)cVar4), iVar5 != 0))) {
                  cVar4 = pcVar13[1];
                  pcVar13 = pcVar13 + 1;
                }
                if (*pcVar13 != '(') goto LAB_00113b6a;
                if ((*local_d8 | 2) == 0x66) {
                  cVar4 = pcVar13[1];
                  local_e0 = pcVar13 + 1;
                  if (cVar4 != '\0') {
                    pcVar8 = pcVar13 + 2;
                    do {
                      pcVar13 = pcVar8;
                      iVar5 = isspace((int)cVar4);
                      if (iVar5 == 0) break;
                      cVar4 = *pcVar13;
                      pcVar8 = pcVar13 + 1;
                      local_e0 = pcVar13;
                    } while (cVar4 != '\0');
                  }
                  sVar11 = skip_numeric(&local_e0,(char *)0x0);
                  pcVar13 = local_e0;
                  if (sVar11 != 0) {
                    local_a8._0_4_ = 0;
                    __isoc99_sscanf(local_e0," )%n",&local_a8);
                    local_e0 = pcVar13 + (int)local_a8._0_4_;
                    if ((long)(int)local_a8._0_4_ != 0) goto LAB_00113b6a;
                  }
                }
              }
              local_e0 = (char *)0x0;
            }
            else {
              local_a8._0_4_ = 0;
              __isoc99_sscanf(local_e0," %*2d:%*1d%*1d%n",&local_a8);
              local_e0 = local_e0 + (int)local_a8._0_4_;
              if ((long)(int)local_a8._0_4_ != 0) {
                local_a8._0_4_ = 0;
                __isoc99_sscanf(local_e0,":%*1d%*1d%n",&local_a8);
                local_e0 = local_e0 + (int)local_a8._0_4_;
                if ((long)(int)local_a8._0_4_ != 0) {
                  local_a8._0_4_ = 0;
                  __isoc99_sscanf(local_e0,".%*d%n",&local_a8);
                  local_e0 = local_e0 + (int)local_a8._0_4_;
                  if ((long)(int)local_a8._0_4_ != 0) {
                    local_a8._0_4_ = 0;
                    __isoc99_sscanf(local_e0," ( ... + 0x%n",&local_a8);
                    local_e0 = local_e0 + (int)local_a8._0_4_;
                    if ((long)(int)local_a8._0_4_ != 0) {
                      local_a8._0_4_ = 0;
                      local_c8 = inside_bundle;
                      __isoc99_sscanf(local_e0,"%*x.%n",&local_a8);
                      pcVar13 = local_e0 + (int)local_a8._0_4_;
                      local_a8._0_4_ = 0;
                      local_e0 = pcVar13;
                      __isoc99_sscanf(pcVar13,"%*xp%n",&local_a8);
                      local_e0 = pcVar13 + (int)local_a8._0_4_;
                      if ((long)(int)local_a8._0_4_ == 0) {
                        local_e0 = (char *)0x0;
                        inside_bundle = local_c8;
                      }
                      else {
                        local_a8._0_4_ = 0;
                        local_c0 = llhssrc;
                        __isoc99_sscanf(local_e0,"-%d s )%n",&local_80,&local_a8);
                        pcVar13 = local_e0 + (int)local_a8._0_4_;
                        local_e0 = (char *)0x0;
                        if (local_80._0_4_ - 1 < 0x20) {
                          local_e0 = pcVar13;
                        }
                        llhssrc = local_c0;
                        inside_bundle = local_c8;
                        if ((long)(int)local_a8._0_4_ == 0) {
                          local_e0 = (char *)0x0;
                        }
                      }
                    }
                  }
                }
              }
              *local_d8 = 0x74;
            }
          }
        }
        else {
          local_e0 = local_e0 + 1;
          do {
            cVar4 = *local_e0;
            local_e0 = local_e0 + 1;
          } while (cVar4 != 'x');
          local_e0 = rtosc_skip_next_printed_arg
                               (local_e0,(int *)&local_a8,(char *)&local_c9,(char *)0x0,0,
                                inside_bundle);
          if (local_e0 != (char *)0x0) {
            *local_d8 = 0x2d;
            *local_90 = *local_90 + local_a8._0_4_;
          }
        }
      }
    }
    else if (bVar1 == 0x27) {
      sVar9 = strlen(src);
      if (sVar9 < 3) {
        return (char *)0x0;
      }
      if ((src[1] == '\\') &&
         ((cVar4 = src[2], cVar4 != '\'' ||
          ((cVar3 = src[3], (long)cVar3 != 0 &&
           (ppuVar7 = __ctype_b_loc(), (*(byte *)((long)*ppuVar7 + (long)cVar3 * 2 + 1) & 0x20) == 0
           )))))) {
        local_e0 = src + 1;
        cVar4 = get_escaped_char(cVar4,1);
        if (cVar4 != '\0') goto LAB_0011360a;
        local_e0 = (char *)0x0;
      }
      else {
LAB_0011360a:
        pcVar13 = local_e0 + 3;
        pcVar8 = local_e0 + 2;
        local_e0 = (char *)0x0;
        if (*pcVar8 == '\'') {
          local_e0 = pcVar13;
        }
      }
      *local_d8 = 99;
    }
    else if (bVar1 == 0x42) {
      local_a8._0_4_ = 0;
      local_c0 = llhssrc;
      __isoc99_sscanf(src,"BLOB [ %n",&local_a8);
      local_e0 = src + (int)local_a8._0_4_;
      if ((long)(int)local_a8._0_4_ == 0) {
        local_e0 = (char *)0x0;
      }
      pcVar13 = local_e0;
      if (local_e0 == (char *)0x0) {
        *local_d8 = 0x53;
        local_e0 = skip_identifier(src);
        llhssrc = local_c0;
      }
      else {
        *local_d8 = 0x62;
        local_80._0_4_ = 0;
        local_60._0_4_ = 0;
        __isoc99_sscanf(local_e0,"%i %n");
        pcVar13 = pcVar13 + (int)local_80._0_4_;
        if ((long)(int)local_80._0_4_ == 0) {
          pcVar13 = (char *)0x0;
        }
        else {
          local_e0 = pcVar13;
          do {
            if (*pcVar13 != '0') goto LAB_00113732;
            local_a8._0_4_ = 0;
            __isoc99_sscanf(pcVar13,"0x%*x %n",&local_a8);
            local_60._0_4_ = local_60._0_4_ + -1;
            pcVar13 = pcVar13 + (int)local_a8._0_4_;
          } while ((long)(int)local_a8._0_4_ != 0);
          pcVar13 = (char *)0x0;
        }
LAB_00113732:
        pcVar8 = (char *)0x0;
        if (local_60._0_4_ == 0) {
          pcVar8 = pcVar13;
        }
        llhssrc = local_c0;
        local_e0 = pcVar8;
        if (pcVar8 != (char *)0x0) {
          local_e0 = (char *)0x0;
          if (*pcVar8 == ']') {
            local_e0 = pcVar8 + 1;
          }
        }
      }
    }
    else {
      if (bVar1 != 0x4d) goto LAB_0011378c;
      iVar5 = strncmp("MIDI",src,4);
      pcVar13 = src;
      if (iVar5 == 0) {
        ppuVar7 = __ctype_b_loc();
        if (((long)src[4] == 0x5b) || (((*ppuVar7)[src[4]] & 0x2000) != 0)) {
          local_a8._0_4_ = 0;
          __isoc99_sscanf(src,"MIDI [ 0x%*x 0x%*x 0x%*x 0x%*x ]%n",&local_a8);
          local_e0 = src + (int)local_a8._0_4_;
          if ((long)(int)local_a8._0_4_ == 0) {
            local_e0 = (char *)0x0;
          }
          *local_d8 = 0x6d;
          goto LAB_00113b6a;
        }
      }
LAB_001138c5:
      local_e0 = skip_identifier(pcVar13);
      *local_d8 = 0x53;
    }
  }
  else if (bVar1 < 0x69) {
    if (bVar1 == 0x5b) {
      local_c0 = (char *)CONCAT44(local_c0._4_4_,follow_ellipsis);
      local_c8 = inside_bundle;
      local_b8 = src;
      ppuVar7 = __ctype_b_loc();
      do {
        pcVar13 = local_e0 + 1;
        local_e0 = local_e0 + 1;
      } while ((*(byte *)((long)*ppuVar7 + (long)*pcVar13 * 2 + 1) & 0x20) != 0);
      bVar15 = false;
      pcVar13 = local_e0;
      pcVar8 = (char *)0x0;
      cVar4 = '\0';
      do {
        pcVar10 = pcVar13;
        if ((*pcVar10 == '\0') || (*pcVar10 == ']')) {
          follow_ellipsis = (int)local_c0;
          local_e0 = pcVar10;
          if (!bVar15) {
            if (*pcVar10 == '\0') {
              local_e0 = (char *)0x0;
            }
            else {
              local_e0 = pcVar10 + 1;
            }
          }
          goto LAB_00113b5d;
        }
        local_80.type = 0x14;
        pcVar13 = rtosc_skip_next_printed_arg(pcVar10,(int *)&local_a8,&local_80.type,pcVar8,1,1);
        if (pcVar13 != (char *)0x0) {
          pcVar13 = pcVar13 + -1;
          do {
            pcVar8 = pcVar13 + 1;
            pcVar13 = pcVar13 + 1;
          } while ((*(byte *)((long)*ppuVar7 + (long)*pcVar8 * 2 + 1) & 0x20) != 0);
        }
        cVar3 = local_80.type;
        if ((((cVar4 != '\0') && (cVar3 = cVar4, cVar4 != local_80.type)) && (cVar4 != '-')) &&
           (((local_80.type != '-' && (local_80.type != 'F' || cVar4 != 'T')) &&
            (local_80.type != 'T' || cVar4 != 'F')))) {
          pcVar13 = (char *)0x0;
        }
        *local_90 = *local_90 + local_a8._0_4_;
        bVar15 = pcVar13 == (char *)0x0;
        pcVar8 = pcVar10;
        cVar4 = cVar3;
      } while (!bVar15);
      follow_ellipsis = (int)local_c0;
      local_e0 = pcVar13;
LAB_00113b5d:
      *local_d8 = 0x61;
      src = local_b8;
      inside_bundle = local_c8;
    }
    else {
      if (bVar1 != 0x66) goto LAB_0011378c;
      pcVar8 = skip_word("false",&local_e0);
      pcVar13 = local_e0;
      if (pcVar8 == (char *)0x0) goto LAB_001138c5;
      *local_d8 = 0x46;
    }
  }
  else if (bVar1 == 0x69) {
    pcVar13 = skip_word("inf",&local_e0);
    if (pcVar13 == (char *)0x0) {
      pcVar13 = "immediately";
LAB_001138a4:
      pcVar8 = skip_word(pcVar13,&local_e0);
      pcVar13 = local_e0;
      if (pcVar8 == (char *)0x0) goto LAB_001138c5;
      *local_d8 = 0x74;
    }
    else {
      *local_d8 = 0x49;
    }
  }
  else if (bVar1 == 0x6e) {
    pcVar13 = skip_word("nil",&local_e0);
    if (pcVar13 == (char *)0x0) {
      pcVar13 = "now";
      goto LAB_001138a4;
    }
    *local_d8 = 0x4e;
  }
  else {
    if (bVar1 != 0x74) goto LAB_0011378c;
    pcVar8 = skip_word("true",&local_e0);
    pcVar13 = local_e0;
    if (pcVar8 == (char *)0x0) goto LAB_001138c5;
    *local_d8 = 0x54;
  }
LAB_00113b6a:
  pcVar13 = local_e0;
  if (local_e0 == (char *)0x0 || follow_ellipsis == 0) {
    return local_e0;
  }
  ppuVar7 = __ctype_b_loc();
  pcVar13 = pcVar13 + 1;
  do {
    pcVar8 = pcVar13;
    pcVar13 = pcVar8 + 1;
  } while ((*(byte *)((long)*ppuVar7 + (long)pcVar8[-1] * 2 + 1) & 0x20) != 0);
  iVar5 = strncmp(pcVar8 + -1,"...",3);
  if (iVar5 != 0) {
    return local_e0;
  }
  local_e0 = (char *)0x0;
  iVar5 = is_range_multiplier(src);
  pcVar10 = src;
  if (iVar5 != 0) {
    pcVar10 = strchr(src,0x78);
    pcVar10 = pcVar10 + 1;
  }
  local_b8 = pcVar10;
  bVar1 = local_c9;
  if (local_c9 == 0) {
    bVar1 = *local_d8;
  }
  local_c2[0] = 0x78;
  local_c2[1] = 0;
  *local_d8 = 0x2d;
  local_88 = 0;
  do {
    cVar4 = pcVar13[1];
    pcVar13 = pcVar13 + 1;
  } while ((*(byte *)((long)*ppuVar7 + (long)cVar4 * 2 + 1) & 0x20) != 0);
  local_c8 = inside_bundle;
  local_d8 = (byte *)memchr("cihfdTF",(int)(char)bVar1,8);
  if (cVar4 == ']') {
    local_c2[0] = bVar1;
    pcVar10 = pcVar13;
  }
  else {
    if (local_d8 == (byte *)0x0) {
      return local_e0;
    }
    pcVar10 = rtosc_skip_next_printed_arg(pcVar13,&local_68,(char *)local_c2,(char *)0x0,0,local_c8)
    ;
    if (pcVar10 == (char *)0x0) {
      return local_e0;
    }
    rtosc_scan_arg_val(pcVar13,&local_60,1,(char *)0x0,&local_88,0,0);
  }
  if (bVar1 != local_c2[0]) {
    return local_e0;
  }
  if (local_d8 != (byte *)0x0) {
    rtosc_scan_arg_val(local_b8,&local_80,1,(char *)0x0,&local_88,0,0);
  }
  bVar15 = true;
  if (llhssrc != (char *)0x0) {
    pcVar13 = strstr(llhssrc,"...");
    if (pcVar13 < pcVar8 + -1) {
      llhssrc = pcVar13 + 2;
      do {
        pcVar13 = llhssrc + 1;
        llhssrc = llhssrc + 1;
      } while ((*(byte *)((long)*ppuVar7 + (long)*pcVar13 * 2 + 1) & 0x20) != 0);
    }
    else {
      iVar5 = is_range_multiplier(llhssrc);
      if (iVar5 != 0) {
        pcVar13 = strchr(llhssrc,0x78);
        llhssrc = pcVar13 + 1;
      }
    }
    rtosc_skip_next_printed_arg(llhssrc,&local_64,(char *)&local_aa,(char *)0x0,0,local_c8);
    bVar15 = true;
    if (((local_aa == bVar1) || (bVar1 == 0x46 && local_aa == 0x54)) ||
       (bVar1 == 0x54 && local_aa == 0x46)) {
      rtosc_scan_arg_val(llhssrc,&local_a8,1,(char *)0x0,&local_88,0,0);
      iVar5 = rtosc_arg_vals_cmp_single(&local_a8,&local_80,(rtosc_cmp_options *)0x0);
      bVar15 = iVar5 == 0;
    }
  }
  if (cVar4 == ']') {
    if (local_d8 == (byte *)0x0 || bVar15 != false) goto LAB_00113e43;
    rhsarg = (rtosc_arg_val_t *)0x0;
  }
  else {
    rhsarg = &local_60;
  }
  iVar6 = delta_from_arg_vals(&local_a8,&local_80,rhsarg,&local_48,(uint)bVar15);
  if ((cVar4 != ']') && (iVar6 == -1)) {
    return local_e0;
  }
  if (iVar6 != -1) {
    *local_90 = *local_90 + 1;
  }
LAB_00113e43:
  *local_90 = *local_90 + 1;
  return pcVar10;
}

Assistant:

const char* rtosc_skip_next_printed_arg(const char* src, int* skipped,
                                        char* type, const char* llhssrc,
                                        int follow_ellipsis, int inside_bundle)
{
    char dummy;
    if(!type)
        type = &dummy;
    assert(skipped);
    assert(src);
    *skipped = 1; // in almost all cases

    char deltaless_range_type = 0;

    const char* old_src = src;
    switch(*src)
    {
        case 't':
            if(skip_word("true", &src))
                *type = 'T';
            else {
                src = skip_identifier(src);
                *type = 'S';
            }
            break;
        case 'f':
            if(skip_word("false", &src))
                *type = 'F';
            else {
                src = skip_identifier(src);
                *type = 'S';
            }
            break;
        case 'n':
            if(skip_word("nil", &src))
                *type = 'N';
            else if(skip_word("now", &src))
                *type = 't';
            else {
                src = skip_identifier(src);
                *type = 'S';
            }
            break;
        case 'i':
            if(skip_word("inf", &src))
                *type = 'I';
            else if(skip_word("immediately", &src))
                *type = 't';
            else {
                src = skip_identifier(src);
                *type = 'S';
            }
            break;
        case '#':
            for(size_t i = 0; i<8; ++i)
            {
                ++src;
                if(!isxdigit(*src)) {
                    src = NULL;
                    i = 8;
                }
            }
            if(src) ++src;
            *type = 'r';
            break;
        case '\'':
        {
            int esc = -1;
            if(strlen(src) < 3)
                return NULL;
            // type 1: '<noslash>' => normal char
            // type 2: '\<noquote>' => escaped char
            // type 3: '\'' => escaped quote
            // type 4: '\' => mistyped backslash
            if(src[1] == '\\') {
                if(src[2] == '\'' && (!src[3] || isspace(src[3])))
                {
                    // type 4
                    // the user inputs '\', which is wrong, but
                    // we accept it as a backslash anyways
                }
                else
                {
                    ++src; // type 2 or 3
                    esc = get_escaped_char(src[1], 1);
                }
            }
            // if the last char was no single quote,
            // or we had an invalid escape sequence, return NULL
            src = (!esc || src[2] != '\'') ? NULL : (src + 3);
            *type = 'c';
            break;
        }
        case '"':
            src = end_of_printed_string(src);
            if(src && *src == 'S') {
                ++src;
                *type = 'S';
            }
            else
                *type = 's';
            break;
        case 'M':
            if(!strncmp("MIDI", src, 4) && (isspace(src[4]) || src[4] == '['))
            {
                skip_fmt_null(&src, "MIDI [ 0x%*x 0x%*x 0x%*x 0x%*x ]%n");
                *type = 'm';
            }
            else {
                src = skip_identifier(src);
                *type = 'S';
            }
            break;
        case '[':
        {
            while(isspace(*++src));
            char arraytype = 0;
            const char* recent_src = NULL;
            while(src && *src && *src != ']')
            {
                char arraytype_cur = 20;
                int skipped2;
                const char* newsrc = rtosc_skip_next_printed_arg(src, &skipped2,
                                                                 &arraytype_cur,
                                                                 recent_src, 1,
                                                                 true);
                recent_src = src;
                src = newsrc;

                if(src)
                    for( ; isspace(*src); ++src) ;
                if(!arraytype)
                    arraytype = arraytype_cur;
                else if(!arraytypes_match(arraytype, arraytype_cur))
                    src = NULL;
                *skipped += skipped2;
            }
            if(src)
            {
                if(*src) // => ']'
                    ++src;
                else
                    src = NULL;
            }
            *type = 'a';
            break;
        }
        case 'B':
        {
            const char* oldsrc = src;
            skip_fmt_null(&src, "BLOB [ %n");
            if(src)
            {
                *type = 'b';
                int rd = 0, blobsize = 0;
                sscanf(src, "%i %n", &blobsize, &rd);
                src = rd ? (src + rd) : NULL;
                for(;src && *src == '0';) // i.e. 0x...
                {
                    skip_fmt_null(&src, "0x%*x %n");
                    blobsize--;
                }
                if(blobsize)
                    src = NULL;
                if(src)
                    src = (*src == ']') ? (src + 1) : NULL;
            }
            else
            {
                *type = 'S';
                src = skip_identifier(oldsrc);
            }
            break;
        }
        default:
        {
            // nx... ? (n > 0)
            if(is_range_multiplier(src))
            {
                while(*++src != 'x') ;
                ++src;

                int skipped2;
                src = rtosc_skip_next_printed_arg(src, &skipped2,
                                                  &deltaless_range_type,
                                                  NULL, 0, inside_bundle);
                if(src) {
                    *type = '-';
                    *skipped += skipped2;
                }
            }
            // is it an identifier?
            else if(*src == '_' || isalpha(*src))
            {
                for(; *src == '_' || isalnum(*src); ++src) ;
                *type = 'S';
            }
            // is it a date? (vs a numeric)
            else if(skip_fmt(&src, "%*4d-%*1d%*1d-%*1d%*1d%n"))
            {
                if(skip_fmt(&src, " %*2d:%*1d%*1d%n"))
                if(skip_fmt(&src, ":%*1d%*1d%n"))
                if(skip_fmt(&src, ".%*d%n"))
                {
                    if(skip_fmt(&src, " ( ... + 0x%n"))
                    {
                        skip_fmt(&src, "%*x.%n");
                        if(skip_fmt(&src, "%*xp%n"))
                        {
                            int rd = 0, expm;
                            sscanf(src, "-%d s )%n", &expm, &rd);
                            if(rd && expm > 0 && expm <= 32)
                            {
                                // ok
                                src += rd;
                            }
                            else
                                src = NULL;

                        }
                        else
                            src = NULL;
                    }
                }
                *type = 't';
            }
            else
            {
                int rd = skip_numeric(&src, type);
                if(!rd) { src = NULL; break; }
                const char* after_num = src;
                skip_while(&after_num, isspace);
                if(*after_num == '(')
                {
                    if (*type == 'f' || *type == 'd')
                    {
                        // skip lossless representation
                        src = ++after_num;
                        skip_while(&src, isspace);
                        rd = skip_numeric(&src, NULL);
                        if(!rd) { src = NULL; break; }
                        skip_fmt_null(&src, " )%n");
                    }
                    else
                        src = NULL;
                }
            }
        }
    }

    if(follow_ellipsis && src)
    {
        // is the argument being followed by an ellipsis?
        const char* src2 = src;
        for(; isspace(*src2); ++src2) ;

        if(!strncmp(src2, "...", 3))
        {
            src = src2;

            // What we need to do is only checking for correctness:
            //  * lhs (left hand sign) and rhs are given
            //  * lhs and rhs must be of the same type
            //  * there must be an "n" such that lhs + n*delta = rhs
            //    => therefore, compute delta
            //  * such "n" must not be 0

            const char* rhssrc = src;
            const char* ellipsis = src;
            src = NULL;
            const char* lhssrc;

            do
            {
                lhssrc = old_src;
                if(is_range_multiplier(lhssrc))
                    lhssrc = strchr(lhssrc, 'x') + 1;

                rtosc_arg_val_t llhsarg, lhsarg, rhsarg;
                char lhstype = deltaless_range_type ? deltaless_range_type
                                                    : *type,
                     llhstype, rhstype[2] = "x";

                *type = '-'; // TODO: bug? return scanned type instead,
                             //       to avoid [0.1 1 ...5]

                size_t zero = 0;
                int llhsskipped, rhsskipped;

                rtosc_arg_val_t delta;

                /*
                 * in all cases, check rhs
                 */
                rhssrc += 2;
                while(isspace(*++rhssrc)) ;

                bool numeric_range  = strchr(numeric_range_types(), lhstype),
                     infinite_range = false;
                const char* endsrc;
                if(*rhssrc == ']')
                {
                    assert(inside_bundle);
                    // we're still not finished. find out if delta-less or not
                    *rhstype = lhstype;
                    endsrc = rhssrc;
                    infinite_range = true;
                }
                else
                {
                    // non-infinite ranges are numeric, so check the type
                    if(!numeric_range)
                        break;

                    endsrc = rtosc_skip_next_printed_arg(rhssrc, &rhsskipped,
                                                         rhstype, NULL, 0,
                                                         inside_bundle);
                    if(!endsrc)
                        break;

                    rtosc_scan_arg_val(rhssrc, &rhsarg, 1, NULL, &zero, 0, 0);
                }

                /*
                 * do not check lhs; it has been checked above
                 */
                if(lhstype != *rhstype)
                {
                    // types must be equal
                    break;
                }

                if(numeric_range)
                    rtosc_scan_arg_val(lhssrc, &lhsarg, 1,
                                       NULL, &zero, 0, 0);

                /*
                 * is llhs given and useful?
                 */
                bool llhsarg_is_useless = false;
                if(llhssrc)
                {
                    const char* next_ellipsis_from_llhssrc =
                            strstr(llhssrc, "...");
                    if(next_ellipsis_from_llhssrc < ellipsis)
                    {
                        llhssrc = next_ellipsis_from_llhssrc + 2;
                        while(isspace(*++llhssrc)) ;
                    }
                    else if(is_range_multiplier(llhssrc))
                    {
                        llhssrc = strchr(llhssrc, 'x') + 1;
                    }

                    rtosc_skip_next_printed_arg(llhssrc,
                                                &llhsskipped, &llhstype,
                                                NULL, 0, inside_bundle);
                    if(types_match(llhstype, lhstype))
                    {
                        rtosc_scan_arg_val(llhssrc, &llhsarg, 1,
                                           NULL, &zero, 0, 0);
                        if(!rtosc_arg_vals_cmp_single(&llhsarg, &lhsarg, NULL))
                        {
                            llhsarg_is_useless = true;
                        }
                        // hint: use rtosc_arg_val_range_arg here if
                        // overlapping ranges (1 ... 5 ... 9) shall be
                        // implemented
                    }
                    else
                    {
                        llhsarg_is_useless = true;
                    }
                }
                else {
                    llhsarg_is_useless = true;
                }

                bool has_delta = true;
                /*
                    compute delta and check if it matches
                */
                if(infinite_range && (llhsarg_is_useless || !numeric_range))
                {
                    has_delta = false;
                }
                else
                {
                    int32_t num = delta_from_arg_vals(&llhsarg, &lhsarg,
                                                      infinite_range ? NULL
                                                                     : &rhsarg,
                                                      &delta,
                                                      llhsarg_is_useless);

                    if(num == -1)
                    {
                        if(infinite_range)
                        {
                            has_delta = false;
                        }
                        else
                        {
                            break;
                        }
                    }
                }

                // if we made it until here, set src to non-NULL
                src = endsrc;

                // ellipsis skips 3 arg vals: range, delta, start
                if(has_delta)
                    ++*skipped;
                ++*skipped;
            } while(false);
        }
    }

    return src;
}